

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_decode_v2(opj_j2k_v2_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                      opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  opj_image_comp_t *poVar3;
  opj_bool oVar4;
  opj_image_t *p_image_dest;
  long lVar5;
  
  oVar4 = 0;
  if (p_image != (opj_image_t *)0x0) {
    p_image_dest = opj_image_create0();
    p_j2k->m_output_image = p_image_dest;
    if (p_image_dest != (opj_image_t *)0x0) {
      opj_copy_image_header(p_image,p_image_dest);
      j2k_setup_decoding(p_j2k);
      oVar4 = j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      if (oVar4 == 0) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = (opj_image_t *)0x0;
        oVar4 = 0;
      }
      else {
        uVar1 = p_image->numcomps;
        for (lVar5 = 0; oVar4 = 1, (ulong)uVar1 * 0x38 - lVar5 != 0; lVar5 = lVar5 + 0x38) {
          poVar2 = p_j2k->m_output_image->comps;
          poVar3 = p_image->comps;
          *(undefined4 *)((long)&poVar3->resno_decoded + lVar5) =
               *(undefined4 *)((long)&poVar2->resno_decoded + lVar5);
          *(undefined8 *)((long)&poVar3->data + lVar5) =
               *(undefined8 *)((long)&poVar2->data + lVar5);
          *(undefined8 *)((long)&poVar2->data + lVar5) = 0;
        }
      }
    }
  }
  return oVar4;
}

Assistant:

opj_bool j2k_decode_v2(	opj_j2k_v2_t * p_j2k,
						opj_stream_private_t * p_stream,
						opj_image_t * p_image,
						opj_event_mgr_t * p_manager)
{
	OPJ_UINT32 compno;

	if (!p_image)
		return OPJ_FALSE;

	p_j2k->m_output_image = opj_image_create0();
	if (! (p_j2k->m_output_image)) {
		return OPJ_FALSE;
	}
	opj_copy_image_header(p_image, p_j2k->m_output_image);

	/* customization of the decoding */
	j2k_setup_decoding(p_j2k);

	/* Decode the codestream */
	if (! j2k_exec (p_j2k,p_j2k->m_procedure_list,p_stream,p_manager)) {
		opj_image_destroy(p_j2k->m_private_image);
		p_j2k->m_private_image = NULL;
		return OPJ_FALSE;
	}

	/* Move data and copy one information from codec to output image*/
	for (compno = 0; compno < p_image->numcomps; compno++) {
		p_image->comps[compno].resno_decoded = p_j2k->m_output_image->comps[compno].resno_decoded;
		p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
		p_j2k->m_output_image->comps[compno].data = NULL;
	}

	return OPJ_TRUE;
}